

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall
icu_63::NFRuleSet::setDecimalFormatSymbols
          (NFRuleSet *this,DecimalFormatSymbols *newSymbols,UErrorCode *status)

{
  uint32_t uVar1;
  NFRule *pNVar2;
  int64_t iVar3;
  int64_t iVar4;
  NFRule *rule;
  uint32_t nnrIdx;
  NFRule *fractionRule;
  int local_28;
  uint32_t fIdx;
  int32_t nonNumericalIdx;
  uint32_t i;
  UErrorCode *status_local;
  DecimalFormatSymbols *newSymbols_local;
  NFRuleSet *this_local;
  
  for (fIdx = 0; uVar1 = NFRuleList::size(&this->rules), fIdx < uVar1; fIdx = fIdx + 1) {
    pNVar2 = NFRuleList::operator[](&this->rules,fIdx);
    NFRule::setDecimalFormatSymbols(pNVar2,newSymbols,status);
  }
  for (local_28 = 1; local_28 < 4; local_28 = local_28 + 1) {
    if (this->nonNumericalRules[local_28] != (NFRule *)0x0) {
      for (fractionRule._4_4_ = 0; uVar1 = NFRuleList::size(&this->fractionRules),
          fractionRule._4_4_ < uVar1; fractionRule._4_4_ = fractionRule._4_4_ + 1) {
        pNVar2 = NFRuleList::operator[](&this->fractionRules,fractionRule._4_4_);
        iVar3 = NFRule::getBaseValue(this->nonNumericalRules[local_28]);
        iVar4 = NFRule::getBaseValue(pNVar2);
        if (iVar3 == iVar4) {
          setBestFractionRule(this,local_28,pNVar2,'\0');
        }
      }
    }
  }
  for (rule._4_4_ = 0; rule._4_4_ < 6; rule._4_4_ = rule._4_4_ + 1) {
    if (this->nonNumericalRules[rule._4_4_] != (NFRule *)0x0) {
      NFRule::setDecimalFormatSymbols(this->nonNumericalRules[rule._4_4_],newSymbols,status);
    }
  }
  return;
}

Assistant:

void
NFRuleSet::setDecimalFormatSymbols(const DecimalFormatSymbols &newSymbols, UErrorCode& status) {
    for (uint32_t i = 0; i < rules.size(); ++i) {
        rules[i]->setDecimalFormatSymbols(newSymbols, status);
    }
    // Switch the fraction rules to mirror the DecimalFormatSymbols.
    for (int32_t nonNumericalIdx = IMPROPER_FRACTION_RULE_INDEX; nonNumericalIdx <= MASTER_RULE_INDEX; nonNumericalIdx++) {
        if (nonNumericalRules[nonNumericalIdx]) {
            for (uint32_t fIdx = 0; fIdx < fractionRules.size(); fIdx++) {
                NFRule *fractionRule = fractionRules[fIdx];
                if (nonNumericalRules[nonNumericalIdx]->getBaseValue() == fractionRule->getBaseValue()) {
                    setBestFractionRule(nonNumericalIdx, fractionRule, FALSE);
                }
            }
        }
    }

    for (uint32_t nnrIdx = 0; nnrIdx < NON_NUMERICAL_RULE_LENGTH; nnrIdx++) {
        NFRule *rule = nonNumericalRules[nnrIdx];
        if (rule) {
            rule->setDecimalFormatSymbols(newSymbols, status);
        }
    }
}